

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void calculate_intermediate_result
               (int32_t *dgd,int width,int height,int dgd_stride,int bit_depth,int sgr_params_idx,
               int radius_idx,int pass,int32_t *A,int32_t *B)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  int32_t *piVar7;
  long lVar8;
  long lVar9;
  int32_t *piVar10;
  int n;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  
  iVar12 = av1_sgr_params[sgr_params_idx].r[(uint)radius_idx];
  uVar2 = width + 9U & 0xfffffffc;
  iVar14 = uVar2 + 0x10;
  boxsum(dgd + (-3 - (long)(dgd_stride * 3)),width + 6,height + 6,dgd_stride,iVar12,0,B,iVar14);
  boxsum(dgd + (-3 - (long)(dgd_stride * 3)),width + 6,height + 6,dgd_stride,iVar12,1,A,iVar14);
  if (-2 < height) {
    lVar9 = 2 - (ulong)(pass == 0);
    uVar11 = iVar12 * 2 | 1;
    iVar12 = uVar11 * uVar11;
    bVar3 = (char)bit_depth - 8;
    bVar4 = (char)bit_depth * '\x02' - 0x10;
    piVar10 = A + (((long)(iVar14 * 3) + -0xe) - (long)(int)uVar2);
    lVar8 = iVar14 * lVar9;
    piVar7 = B + (((long)(iVar14 * 3) + -0xe) - (long)(int)uVar2);
    lVar5 = -1;
    do {
      if (-2 < width) {
        iVar14 = *(int *)((long)sgr_params_idx * 0x10 + 0x558a08 + (ulong)(uint)radius_idx * 4);
        iVar1 = av1_one_by_x[iVar12 - 1];
        lVar13 = 0;
        do {
          iVar6 = piVar7[lVar13] + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f);
          uVar11 = ((int)(piVar10[lVar13] + ((uint)(1 << (bVar4 & 0x1f)) >> 1)) >> (bVar4 & 0x1f)) *
                   iVar12;
          uVar2 = iVar6 * iVar6;
          iVar6 = uVar11 - uVar2;
          if (uVar11 < uVar2) {
            iVar6 = 0;
          }
          uVar2 = iVar6 * iVar14 + 0x80000U >> 0x14;
          if (0xfe < uVar2) {
            uVar2 = 0xff;
          }
          iVar6 = av1_x_by_xplus1[uVar2];
          piVar10[lVar13] = iVar6;
          piVar7[lVar13] = (0x100 - iVar6) * piVar7[lVar13] * iVar1 + 0x800U >> 0xc;
          lVar13 = lVar13 + 1;
        } while ((ulong)(width + 1) + 1 != lVar13);
      }
      lVar5 = lVar5 + lVar9;
      piVar10 = piVar10 + lVar8;
      piVar7 = piVar7 + lVar8;
    } while (lVar5 <= height);
  }
  return;
}

Assistant:

static void calculate_intermediate_result(int32_t *dgd, int width, int height,
                                          int dgd_stride, int bit_depth,
                                          int sgr_params_idx, int radius_idx,
                                          int pass, int32_t *A, int32_t *B) {
  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  const int r = params->r[radius_idx];
  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;
  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes, for consistency
  // with the SIMD version of this function.
  int buf_stride = ((width_ext + 3) & ~3) + 16;
  const int step = pass == 0 ? 1 : 2;
  int i, j;

  assert(r <= MAX_RADIUS && "Need MAX_RADIUS >= r");
  assert(r <= SGRPROJ_BORDER_VERT - 1 && r <= SGRPROJ_BORDER_HORZ - 1 &&
         "Need SGRPROJ_BORDER_* >= r+1");

  boxsum(dgd - dgd_stride * SGRPROJ_BORDER_VERT - SGRPROJ_BORDER_HORZ,
         width_ext, height_ext, dgd_stride, r, 0, B, buf_stride);
  boxsum(dgd - dgd_stride * SGRPROJ_BORDER_VERT - SGRPROJ_BORDER_HORZ,
         width_ext, height_ext, dgd_stride, r, 1, A, buf_stride);
  A += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  B += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  // Calculate the eventual A[] and B[] arrays. Include a 1-pixel border - ie,
  // for a 64x64 processing unit, we calculate 66x66 pixels of A[] and B[].
  for (i = -1; i < height + 1; i += step) {
    for (j = -1; j < width + 1; ++j) {
      const int k = i * buf_stride + j;
      const int n = (2 * r + 1) * (2 * r + 1);

      // a < 2^16 * n < 2^22 regardless of bit depth
      uint32_t a = ROUND_POWER_OF_TWO(A[k], 2 * (bit_depth - 8));
      // b < 2^8 * n < 2^14 regardless of bit depth
      uint32_t b = ROUND_POWER_OF_TWO(B[k], bit_depth - 8);

      // Each term in calculating p = a * n - b * b is < 2^16 * n^2 < 2^28,
      // and p itself satisfies p < 2^14 * n^2 < 2^26.
      // This bound on p is due to:
      // https://en.wikipedia.org/wiki/Popoviciu's_inequality_on_variances
      //
      // Note: Sometimes, in high bit depth, we can end up with a*n < b*b.
      // This is an artefact of rounding, and can only happen if all pixels
      // are (almost) identical, so in this case we saturate to p=0.
      uint32_t p = (a * n < b * b) ? 0 : a * n - b * b;

      const uint32_t s = params->s[radius_idx];

      // p * s < (2^14 * n^2) * round(2^20 / n^2 eps) < 2^34 / eps < 2^32
      // as long as eps >= 4. So p * s fits into a uint32_t, and z < 2^12
      // (this holds even after accounting for the rounding in s)
      const uint32_t z = ROUND_POWER_OF_TWO(p * s, SGRPROJ_MTABLE_BITS);

      // Note: We have to be quite careful about the value of A[k].
      // This is used as a blend factor between individual pixel values and the
      // local mean. So it logically has a range of [0, 256], including both
      // endpoints.
      //
      // This is a pain for hardware, as we'd like something which can be stored
      // in exactly 8 bits.
      // Further, in the calculation of B[k] below, if z == 0 and r == 2,
      // then A[k] "should be" 0. But then we can end up setting B[k] to a value
      // slightly above 2^(8 + bit depth), due to rounding in the value of
      // av1_one_by_x[25-1].
      //
      // Thus we saturate so that, when z == 0, A[k] is set to 1 instead of 0.
      // This fixes the above issues (256 - A[k] fits in a uint8, and we can't
      // overflow), without significantly affecting the final result: z == 0
      // implies that the image is essentially "flat", so the local mean and
      // individual pixel values are very similar.
      //
      // Note that saturating on the other side, ie. requring A[k] <= 255,
      // would be a bad idea, as that corresponds to the case where the image
      // is very variable, when we want to preserve the local pixel value as
      // much as possible.
      A[k] = av1_x_by_xplus1[AOMMIN(z, 255)];  // in range [1, 256]

      // SGRPROJ_SGR - A[k] < 2^8 (from above), B[k] < 2^(bit_depth) * n,
      // av1_one_by_x[n - 1] = round(2^12 / n)
      // => the product here is < 2^(20 + bit_depth) <= 2^32,
      // and B[k] is set to a value < 2^(8 + bit depth)
      // This holds even with the rounding in av1_one_by_x and in the overall
      // result, as long as SGRPROJ_SGR - A[k] is strictly less than 2^8.
      B[k] = (int32_t)ROUND_POWER_OF_TWO((uint32_t)(SGRPROJ_SGR - A[k]) *
                                             (uint32_t)B[k] *
                                             (uint32_t)av1_one_by_x[n - 1],
                                         SGRPROJ_RECIP_BITS);
    }
  }
}